

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void terminal_clear_EOL(EditLine *el,wchar_t num)

{
  char *pcVar1;
  wchar_t wVar2;
  
  if (((((el->el_terminal).t_flags & L'\x04') != L'\0') &&
      (pcVar1 = (el->el_terminal).t_str[3], pcVar1 != (char *)0x0)) && (*pcVar1 != '\0')) {
    terminal_outfile = el->el_outfile;
    tputs(pcVar1,1,terminal_putc);
    return;
  }
  wVar2 = num;
  if (L'\0' < num) {
    do {
      terminal__putc(el,0x20);
      wVar2 = wVar2 + L'\xffffffff';
    } while (wVar2 != L'\0');
  }
  (el->el_cursor).h = (el->el_cursor).h + num;
  return;
}

Assistant:

libedit_private void
terminal_clear_EOL(EditLine *el, int num)
{
	int i;

	if (EL_CAN_CEOL && GoodStr(T_ce))
		terminal_tputs(el, Str(T_ce), 1);
	else {
		for (i = 0; i < num; i++)
			terminal__putc(el, ' ');
		el->el_cursor.h += num;	/* have written num spaces */
	}
}